

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1527.c
# Opt level: O1

size_t read_callback(void *ptr,size_t size,size_t nmemb,void *stream)

{
  size_t sVar1;
  
  sVar1 = strlen(data);
  if (size * nmemb < sVar1) {
    return sVar1;
  }
  memcpy(ptr,data,sVar1);
  sVar1 = strlen(data);
  return sVar1;
}

Assistant:

static size_t read_callback(void *ptr, size_t size, size_t nmemb, void *stream)
{
  size_t  amount = nmemb * size; /* Total bytes curl wants */
  if(amount < strlen(data)) {
    return strlen(data);
  }
  (void)stream;
  memcpy(ptr, data, strlen(data));
  return strlen(data);
}